

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FArchive * operator<<(FArchive *arc,FState **state)

{
  bool bVar1;
  DWORD DVar2;
  PClassActor *pPStack_30;
  DWORD ofs;
  PClassActor *info_1;
  PClassActor *info;
  FState **state_local;
  FArchive *arc_local;
  
  info = (PClassActor *)state;
  state_local = (FState **)arc;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    if ((info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
        super_DObject._vptr_DObject == (_func_int **)0x0) {
      FArchive::UserWriteClass((FArchive *)state_local,AActor::RegistrationInfo.MyClass);
      FArchive::WriteCount((FArchive *)state_local,0x7f);
      return (FArchive *)state_local;
    }
    info_1 = FState::StaticFindStateOwner
                       ((FState *)
                        (info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                        super_PType.super_DObject._vptr_DObject);
    if (info_1 != (PClassActor *)0x0) {
      FArchive::UserWriteClass((FArchive *)state_local,&info_1->super_PClass);
      FArchive::WriteCount
                ((FArchive *)state_local,
                 (DWORD)(((long)(info->super_PClass).super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.super_DObject._vptr_DObject -
                         (long)info_1->OwnedStates) / 0x28));
    }
  }
  else {
    FArchive::UserReadClass<PClassActor>((FArchive *)state_local,&stack0xffffffffffffffd0);
    DVar2 = FArchive::ReadCount((FArchive *)state_local);
    if ((DVar2 == 0x7f) && (pPStack_30 == (PClassActor *)AActor::RegistrationInfo.MyClass)) {
      (info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_DObject._vptr_DObject = (_func_int **)0x0;
    }
    else {
      (info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_DObject._vptr_DObject = (_func_int **)(pPStack_30->OwnedStates + DVar2);
    }
  }
  return (FArchive *)state_local;
}

Assistant:

FArchive &operator<< (FArchive &arc, FState *&state)
{
	PClassActor *info;

	if (arc.IsStoring ())
	{
		if (state == NULL)
		{
			arc.UserWriteClass (RUNTIME_CLASS(AActor));
			arc.WriteCount (NULL_STATE_INDEX);
			return arc;
		}

		info = FState::StaticFindStateOwner (state);

		if (info != NULL)
		{
			arc.UserWriteClass (info);
			arc.WriteCount ((DWORD)(state - info->OwnedStates));
		}
		else
		{
			/* this was never working as intended.
			I_Error ("Cannot find owner for state %p:\n"
					 "%s %c%c %3d [%p] -> %p", state,
					 sprites[state->sprite].name,
					 state->GetFrame() + 'A',
					 state->GetFullbright() ? '*' : ' ',
					 state->GetTics(),
					 state->GetAction(),
					 state->GetNextState());
			*/
		}
	}
	else
	{
		PClassActor *info;
		DWORD ofs;

		arc.UserReadClass<PClassActor>(info);
		ofs = arc.ReadCount ();
		if (ofs == NULL_STATE_INDEX && info == RUNTIME_CLASS(AActor))
		{
			state = NULL;
		}
		else
		{
			state = info->OwnedStates + ofs;
		}
	}
	return arc;
}